

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int linb::any_cast<int>(any *operand)

{
  int iVar1;
  int *piVar2;
  bad_any_cast *this;
  int *p;
  any *operand_local;
  
  piVar2 = any_cast<int>(operand);
  if (piVar2 == (int *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  iVar1 = detail::any_cast_move_if_true<int>(piVar2);
  return iVar1;
}

Assistant:

inline ValueType any_cast(any&& operand)
{
    using can_move = std::integral_constant<bool,
        std::is_move_constructible<ValueType>::value
        && !std::is_lvalue_reference<ValueType>::value>;

    auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
#ifndef ANY_IMPL_NO_EXCEPTIONS
    if(p == nullptr) throw bad_any_cast();
#endif
    return detail::any_cast_move_if_true<ValueType>(p, can_move());
}